

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int fetch_label(char *dest,char *src,char *base,char **next)

{
  ushort *puVar1;
  ushort uVar2;
  long lVar3;
  byte bVar4;
  short sVar5;
  short sVar6;
  ulong uVar7;
  
  do {
    sVar5 = 0;
    uVar7 = 0;
    while( true ) {
      puVar1 = (ushort *)(src + sVar5);
      bVar4 = src[sVar5];
      sVar6 = (short)uVar7;
      if (bVar4 == 0) {
        dest[(long)sVar6 + -1] = '\0';
        if (next != (char **)0x0) {
          *next = (char *)puVar1;
        }
        return sVar6 + -1;
      }
      if (0x3f < bVar4) break;
      for (lVar3 = 1; lVar3 <= (char)bVar4; lVar3 = lVar3 + 1) {
        dest[(short)(sVar6 + (short)lVar3 + -1)] = *(byte *)((long)puVar1 + lVar3);
        bVar4 = (byte)*puVar1;
      }
      uVar7 = (uVar7 & 0xffff) + lVar3;
      dest[(short)((short)uVar7 + -1)] = '.';
      sVar5 = sVar5 + (char)(byte)*puVar1 + 1;
    }
    uVar2 = *puVar1;
    if (next != (char **)0x0) {
      *next = (char *)(puVar1 + 1);
    }
    dest = dest + sVar6;
    src = base + (ushort)((uVar2 & 0xff3f) << 8 | uVar2 >> 8);
    next = (char **)0x0;
  } while( true );
}

Assistant:

int fetch_label(char *dest, char *src, char *base, char **next) {
  /*
  获取标签。

  dest: 要复制到的字符串
  src:  压缩字符串开始的位置
  base: DNS报文头
  next:串结束的位置，不需要的话可以传入一个NULL
  返回值：
  -1： 异常
  其他正数： 读取的字符串长度

  压缩方案使得标签有如下三种可能：
  * 以'\0'结束
  * 以指针结束
  * 指针（只有一个指针）
  并且，一个标签最多只有一个指针。

  下面的解决方案是：
  * 如果头是指针，直接整个复制下来。
  * 否则，按正常的读取，直到遇到指针或者0.
  * 遇到0，则终止；否则整个复制下来，结束。
  */
  short now = 0;
  short i = 0;
  
  while (src[now] != 0) {
    // printf("%d ",now);fflush(stdout);
    if (is_compress(src[now])) {
      unsigned short pos =
          get_compress_pos(ntohs(*(const unsigned short *)(src + now)));
      // printf("pos=%d ",pos);fflush(stdout);
      if (next)
        *next = src + now + 2;
      return fetch_label(dest + i, base + pos, base, NULL);
    } else {
      // printf(" bbb ");fflush(stdout);
      for (short j = 1; j <= src[now]; j++){
        dest[i++] = src[j + now];
      }
      dest[i++] = '.';
      now += src[now] + 1;
    }
  }
  dest[i - 1] = '\0';
  if (next)
    *next = src + now;
  // printf("\n");fflush(stdout);
  return i - 1;
}